

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nick.cpp
# Opt level: O3

void __thiscall Enterprise::Nick::output_character<1,8>(Nick *this,uint16_t *target,int columns)

{
  byte bVar1;
  byte bVar2;
  uint8_t *puVar3;
  uint16_t *puVar4;
  int iVar5;
  
  if (0 < columns) {
    puVar3 = this->ram_;
    iVar5 = 0;
    do {
      bVar1 = puVar3[*(int *)this->line_data_pointer_ + iVar5 & 0xffff];
      bVar2 = puVar3[(this->line_data_pointer_[1] & 0xff) << 8 | (uint)bVar1];
      this->last_read_ = bVar2;
      puVar4 = this->alt_ind_palettes[bVar1 >> 6];
      *target = puVar4[bVar2 >> 7];
      target[1] = *(uint16_t *)((long)puVar4 + (ulong)(bVar2 >> 5 & 2));
      target[2] = *(uint16_t *)((long)puVar4 + (ulong)(bVar2 >> 4 & 2));
      target[3] = *(uint16_t *)((long)puVar4 + (ulong)(bVar2 >> 3 & 2));
      target[4] = *(uint16_t *)((long)puVar4 + (ulong)(bVar2 >> 2 & 2));
      target[5] = *(uint16_t *)((long)puVar4 + (ulong)(bVar2 >> 1 & 2));
      target[6] = *(uint16_t *)((long)puVar4 + (ulong)(bVar2 & 2));
      target[7] = puVar4[bVar2 & 1];
      target = target + 8;
      iVar5 = iVar5 + 1;
    } while (columns != iVar5);
  }
  return;
}

Assistant:

void Nick::output_character(uint16_t *target, int columns) const {
	static_assert(bpp == 1 || bpp == 2 || bpp == 4 || bpp == 8);

	for(int c = 0; c < columns; c++) {
		const uint8_t character = ram_[(line_data_pointer_[0] + c) & 0xffff];
		const uint8_t pixels = ram_[(
			(line_data_pointer_[1] << index_bits) +
			(character & ((1 << index_bits) - 1))
		) & 0xffff];
		last_read_ = pixels;

		switch(bpp) {
			default:
				assert(false);
			break;

			case 1: {
				// This applies ALTIND0 and ALTIND1.
				const uint16_t *palette = alt_ind_palettes[character >> 6];
				output1bpp(pixels);
			} break;

			case 2:		output2bpp(pixels);		break;
			case 4:		output4bpp(pixels);		break;
			case 8:		output8bpp(pixels);		break;
		}
	}
}